

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  size_type sVar4;
  ostream *poVar5;
  size_type __n;
  AdjList *g;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  *this;
  __type _Var6;
  undefined1 auVar7 [16];
  Graph G;
  vector<unsigned_long,_std::allocator<unsigned_long>_> pred;
  WeightMap weight;
  vector<long,_std::allocator<long>_> dist;
  vector<int,_std::allocator<int>_> label;
  variables_map args;
  Graph GStack_328;
  Graph local_2f0;
  WeightMap local_2b8;
  int local_2ac;
  _Vector_base<long,_std::allocator<long>_> local_2a8;
  _Vector_base<int,_std::allocator<int>_> local_290;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_278;
  _Vector_base<int,_std::allocator<int>_> local_260;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_248;
  _Vector_base<long,_std::allocator<long>_> local_230;
  double local_218;
  double dStack_210;
  string local_208;
  string local_1e8;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  local_1c8;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  local_190;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  local_158;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  local_120;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  local_e8;
  variables_map local_b0 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_a0 [144];
  
  nodes = 100;
  times = 1;
  minWeight = -100;
  maxWeight = 10000;
  parseArguments((int)local_b0,(char **)(ulong)(uint)argc);
  if (edges == 0) {
    lVar2 = nodes * 0x14;
    auVar7._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar7._0_8_ = lVar2;
    auVar7._12_4_ = 0x45300000;
    dStack_210 = auVar7._8_8_ - 1.9342813113834067e+25;
    local_218 = dStack_210 + ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0);
    _Var6 = std::log10<unsigned_long>(nodes);
    uVar3 = (ulong)(_Var6 * local_218);
    edges = (long)(_Var6 * local_218 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
  }
  std::__cxx11::string::string((string *)&GStack_328,"test",(allocator *)&local_2f0);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_a0,(key_type *)&GStack_328);
  std::__cxx11::string::~string((string *)&GStack_328);
  if (sVar4 != 0) {
    testAll();
    goto LAB_00107191;
  }
  std::__cxx11::string::string((string *)&GStack_328,"benchmark",(allocator *)&local_2a8);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_a0,(key_type *)&GStack_328);
  if (sVar4 == 0) {
    std::__cxx11::string::~string((string *)&GStack_328);
LAB_00106c03:
    std::__cxx11::string::string((string *)&GStack_328,"benchmark",(allocator *)&local_2a8);
    sVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_a0,(key_type *)&GStack_328);
    if (sVar4 == 0) {
      std::__cxx11::string::~string((string *)&GStack_328);
    }
    else {
      std::__cxx11::string::string((string *)&local_2f0,"grid",(allocator *)&local_290);
      sVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count(local_a0,(key_type *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&GStack_328);
      if (sVar4 != 0) {
        createGridGraph(&GStack_328,(int)nodes,minWeight,maxWeight);
        poVar5 = std::operator<<((ostream *)&std::cout,"[i] Benchmark grid graph ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        poVar5 = std::operator<<(poVar5,"x");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::endl<char,std::char_traits<char>>(poVar5);
        boost::
        adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
        ::adjacency_list(&local_120,&GStack_328);
        benchmark(&local_120,times);
        this = &local_120;
        goto LAB_00106cff;
      }
    }
    std::__cxx11::string::string((string *)&GStack_328,"run",(allocator *)&local_2f0);
    sVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_a0,(key_type *)&GStack_328);
    std::__cxx11::string::~string((string *)&GStack_328);
    if (sVar4 == 0) goto LAB_00107191;
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
    ::adjacency_list(&GStack_328,(no_property *)&local_2f0);
    std::__cxx11::string::string((string *)&local_2f0,"random",(allocator *)&local_2a8);
    sVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_a0,(key_type *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    if (sVar4 == 0) {
      std::__cxx11::string::string((string *)&local_2f0,"grid",(allocator *)&local_2a8);
      sVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count(local_a0,(key_type *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      if (sVar4 == 0) goto LAB_00107189;
      poVar5 = std::operator<<((ostream *)&std::cout,"[i] Grid graph ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,"x");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::endl<char,std::char_traits<char>>(poVar5);
      createGridGraph(&local_2f0,(int)nodes,minWeight,maxWeight);
      boost::
      adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
      ::operator=(&GStack_328,&local_2f0);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"[i] Random graph ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,"x");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::endl<char,std::char_traits<char>>(poVar5);
      createRandomGraph(&local_2f0,nodes,edges,minWeight,maxWeight);
      boost::
      adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
      ::operator=(&GStack_328,&local_2f0);
    }
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
    ::~adjacency_list(&local_2f0);
    __n = (long)GStack_328.super_type.m_vertices.
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)GStack_328.super_type.m_vertices.
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2f0,__n,
               (allocator_type *)&local_2a8);
    local_290._M_impl.super__Vector_impl_data._M_start = (pointer)0x7fffffff;
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)&local_2a8,__n,
               (value_type_conflict2 *)&local_290,(allocator_type *)&local_2b8);
    local_2b8.tag = 0;
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
    ::adjacency_list(&local_158,&GStack_328);
    std::__cxx11::string::string((string *)&local_1e8,"graph.dot",(allocator *)&local_290);
    printGraphVizToFile(&local_158,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
    ::~adjacency_list(&local_158);
    local_290._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_290._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    bVar1 = bellmanFord(&GStack_328,(int *)&local_290,&local_2b8,
                        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2f0,
                        (vector<long,_std::allocator<long>_> *)&local_2a8);
    if (!bVar1) {
      poVar5 = std::operator<<((ostream *)&std::cout,"negative cycle detected");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    local_2ac = 0;
    CHECK_BELLMAN_FORD((vector<int,_std::allocator<int>_> *)&local_290,&GStack_328,&local_2ac,
                       &local_2b8,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2f0,
                       (vector<long,_std::allocator<long>_> *)&local_2a8);
    poVar5 = std::operator<<((ostream *)&std::cout,"[+] Test OK!");
    std::endl<char,std::char_traits<char>>(poVar5);
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
    ::adjacency_list(&local_190,&GStack_328);
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)&local_230,
               (vector<long,_std::allocator<long>_> *)&local_2a8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_248,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2f0);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_260,
               (vector<int,_std::allocator<int>_> *)&local_290);
    printGraphShortestPath
              (&local_190,(vector<long,_std::allocator<long>_> *)&local_230,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_248,
               (vector<int,_std::allocator<int>_> *)&local_260);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_260);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_248);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_230);
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
    ::~adjacency_list(&local_190);
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
    ::adjacency_list(&local_1c8,&GStack_328);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_278,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2f0);
    std::__cxx11::string::string((string *)&local_208,"shortest-path.dot",(allocator *)&local_2ac);
    printGraphShortestPathVizToFile
              (&local_1c8,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_278,
               &local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_278);
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
    ::~adjacency_list(&local_1c8);
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "Run the following (if you have graphviz installed) to see the graph images:"
                            );
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "  neato -Tpng graph.dot -o graph.png && xdg-open  graph.png");
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "  neato -Tpng shortest-path.dot -o shortest-path.png && xdg-open shortest-path.png"
                            );
    std::endl<char,std::char_traits<char>>(poVar5);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_290);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_2a8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2f0);
  }
  else {
    std::__cxx11::string::string((string *)&local_2f0,"random",(allocator *)&local_290);
    sVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_a0,(key_type *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&GStack_328);
    if (sVar4 == 0) goto LAB_00106c03;
    createRandomGraph(&GStack_328,nodes,edges,minWeight,maxWeight);
    poVar5 = std::operator<<((ostream *)&std::cout,"[i] Benchmark random graph ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,"x");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
    ::adjacency_list(&local_e8,&GStack_328);
    benchmark(&local_e8,times);
    this = &local_e8;
LAB_00106cff:
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
    ::~adjacency_list(this);
  }
LAB_00107189:
  boost::
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  ::~adjacency_list(&GStack_328);
LAB_00107191:
  boost::program_options::variables_map::~variables_map(local_b0);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    const int INF = (std::numeric_limits < int >::max)();
    nodes = 100;
    times = 1;
    minWeight = -100;
    maxWeight = 10000;

    boost::program_options::variables_map args = parseArguments(argc, argv);
    if (edges==0) {
        edges = static_cast<unsigned long>(20 * nodes * log10(nodes));
    }

    if (args.count("test")) {
        testAll();
    }
    else if (args.count("benchmark") && args.count("random")) {
        Graph G = createRandomGraph(nodes, edges, minWeight, maxWeight);
        std::cout << "[i] Benchmark random graph " << nodes << "x" << edges << std::endl;
        benchmark(G, times);
    }
    else if (args.count("benchmark") && args.count("grid")) {
        Graph G = createGridGraph(static_cast<int>(nodes), minWeight, maxWeight);
        std::cout << "[i] Benchmark grid graph " << nodes << "x" << nodes << std::endl;
        benchmark(G, times);
    }
    else if (args.count("run")) {
        Graph G;
        if (args.count("random")) {
            std::cout << "[i] Random graph " << nodes << "x" << edges << std::endl;
            G = createRandomGraph(nodes, edges, minWeight, maxWeight);
        }
        else if (args.count("grid")) {
            std::cout << "[i] Grid graph " << nodes << "x" << nodes << std::endl;
            G = createGridGraph(static_cast<int>(nodes), minWeight, maxWeight);
        }
        else {
            return 0;
        }

        unsigned long  N = num_vertices(G);
        std::vector<unsigned long> pred(N);
        std::vector<long> dist(N, INF);
        WeightMap weight = get(&EdgeProperties::weight, G);
        printGraphVizToFile(G, "graph.dot");
        bool res = bellmanFord(G, 0, weight, pred, dist);
        if (!res) {
            std::cout << "negative cycle detected" << std::endl;
        }
        std::vector<int> label = CHECK_BELLMAN_FORD(G, 0, weight, pred, dist);
        std::cout << "[+] Test OK!" << std::endl;
        printGraphShortestPath(G, dist, pred, label);
        printGraphShortestPathVizToFile(G, pred, "shortest-path.dot");
        std::cout << "Run the following (if you have graphviz installed) to see the graph images:" << std::endl;
        std::cout << "  neato -Tpng graph.dot -o graph.png && xdg-open  graph.png" << std::endl;
        std::cout << "  neato -Tpng shortest-path.dot -o shortest-path.png && xdg-open shortest-path.png" << std::endl;
    }

    return 0;
}